

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O2

void __thiscall OPL::DOSBox::DBOPL::Operator::WriteE0(Operator *this,Chip *chip,Bit8u val)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  
  if (this->regE0 != val) {
    bVar1 = chip->waveFormMask;
    bVar2 = chip->opl3Active;
    this->regE0 = val;
    uVar3 = (uint)((bVar2 & 7 | bVar1 & 3) & val) * 2;
    this->waveBase = &WaveTable + *(ushort *)(WaveBaseTable + uVar3);
    this->waveStart = (uint)*(ushort *)(WaveStartTable + uVar3) << 0x16;
    this->waveMask = (uint)*(ushort *)(WaveMaskTable + uVar3);
  }
  return;
}

Assistant:

void Operator::WriteE0( const Chip* chip, Bit8u val ) {
	if ( !(regE0 ^ val) )
		return;
	//in opl3 mode you can always selet 7 waveforms regardless of waveformselect
	Bit8u waveForm = val & ( ( 0x3 & chip->waveFormMask ) | (0x7 & chip->opl3Active ) );
	regE0 = val;
#if ( DBOPL_WAVE == WAVE_HANDLER )
	waveHandler = WaveHandlerTable[ waveForm ];
#else
	waveBase = WaveTable + WaveBaseTable[ waveForm ];
	waveStart = WaveStartTable[ waveForm ] << WAVE_SH;
	waveMask = WaveMaskTable[ waveForm ];
#endif
}